

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
CheckCompress(TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
              *this)

{
  int64_t iVar1;
  
  iVar1 = TPZFrontNonSym<long_double>::NFree(&this->fFront);
  if (20.0 < ((double)iVar1 / (double)(int)(this->fFront).super_TPZFront<long_double>.fFront) *
             100.0) {
    TPZFrontNonSym<long_double>::Compress(&this->fFront);
    return;
  }
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::CheckCompress()
{
	double nfreerate = ( (double)fFront.NFree() / (double)fFront.FrontSize() ) * 100;
	if(nfreerate>20.) 
	{
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Compressing front nfreerate " << nfreerate << " NFree " << fFront.NFree() << " Front elements " << fFront.FrontSize();
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		fFront.Compress();
#ifdef PZ_LOG
        if (loggerfw.isInfoEnabled())
		{
			std::stringstream sout;
			sout << "Frondwidth after Compress "<< fFront.FrontSize();
			LOGPZ_INFO(loggerfw,sout.str())
		}
#endif
	}
}